

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int act_swap_hdrs(nt_opts *opts)

{
  int iVar1;
  nifti_1_header *h;
  nifti_image *nim;
  size_t sVar2;
  char *fname;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint is_nifti;
  long lVar7;
  int swap;
  char *local_48;
  char func [13];
  
  builtin_strncpy(func + 8,"hdrs",5);
  builtin_strncpy(func,"act_mod_",8);
  swap = opts->swap_ana + opts->swap_hdr + opts->swap_old;
  uVar5 = 1;
  if (swap < 2) {
    if (swap != 0) {
      if (2 < g_debug) {
        fprintf(_stderr,"-d swapping headers of %d files...\n",(ulong)(uint)(opts->infiles).len);
      }
      local_48 = opts->command;
      for (lVar7 = 0; lVar7 < (opts->infiles).len; lVar7 = lVar7 + 1) {
        fname = (opts->infiles).list[lVar7];
        iVar1 = nifti_is_gzfile(fname);
        if (iVar1 == 0) {
          h = nt_read_header(opts,fname,&swap,0);
          if (h == (nifti_1_header *)0x0) {
            return 1;
          }
          if (1 < g_debug) {
            if (opts->swap_ana == 0) {
              pcVar4 = "";
              pcVar3 = "NIfTI";
              if (opts->swap_old != 0) {
                if (((h->magic[0] == 'n') && (h->magic[3] == '\0')) &&
                   ((h->magic[1] == 'i' || (h->magic[1] == '+')))) {
                  pcVar4 = "OLD ";
                  pcVar3 = "NIfTI";
                  if ((byte)(h->magic[2] - 0x31U) < 9) goto LAB_00108cbd;
                }
                goto LAB_00108ca2;
              }
            }
            else {
LAB_00108ca2:
              pcVar4 = "OLD ";
              if (opts->swap_old == 0) {
                pcVar4 = "";
              }
              pcVar3 = "ANALYZE";
            }
LAB_00108cbd:
            fprintf(_stderr,"-d %sswapping %s header of file %s\n",pcVar4,pcVar3,fname);
          }
          if (swap == 0) {
            if (opts->swap_old == 0) {
              uVar6 = (uint)(opts->swap_ana == 0);
              goto LAB_00108a93;
            }
            uVar6 = 0;
            if (((h->magic[0] == 'n') && (h->magic[3] == '\0')) &&
               (((uVar6 = 0, h->magic[1] == 'i' || (h->magic[1] == '+')) &&
                ((byte)(h->magic[2] - 0x31U) < 9)))) {
              uVar6 = (uint)(byte)(h->magic[2] - 0x30);
            }
LAB_00108b49:
            old_swap_nifti_header(h,uVar6);
          }
          else {
            if (((((opts->swap_ana == 0) || (h->magic[0] != 'n')) || (h->magic[3] != '\0')) ||
                ((h->magic[1] != 'i' && (h->magic[1] != '+')))) || (8 < (byte)(h->magic[2] - 0x31U))
               ) {
              if ((opts->swap_hdr == 0) ||
                 ((((h->magic[0] == 'n' && (h->magic[3] == '\0')) &&
                   ((h->magic[1] == 'i' || (h->magic[1] == '+')))) &&
                  ((byte)(h->magic[2] - 0x31U) < 9)))) {
                if (opts->swap_old != 0) {
                  uVar6 = 0;
                  is_nifti = 0;
                  if ((((h->magic[0] == 'n') && (h->magic[3] == '\0')) &&
                      ((h->magic[1] == 'i' || (h->magic[1] == '+')))) &&
                     ((byte)(h->magic[2] - 0x31U) < 9)) {
                    is_nifti = (uint)(byte)(h->magic[2] - 0x30);
                  }
                  swap_nifti_header(h,is_nifti);
                  if ((((h->magic[0] == 'n') && (h->magic[3] == '\0')) &&
                      ((h->magic[1] == 'i' || (h->magic[1] == '+')))) &&
                     (uVar6 = 0, (byte)(h->magic[2] - 0x31U) < 9)) {
                    uVar6 = (uint)(byte)(h->magic[2] - 0x30);
                  }
                  goto LAB_00108b49;
                }
                goto LAB_00108b4e;
              }
              swap_nifti_header(h,0);
              uVar6 = uVar5;
            }
            else {
              swap_nifti_header(h,1);
              uVar6 = 0;
            }
LAB_00108a93:
            swap_nifti_header(h,uVar6);
          }
LAB_00108b4e:
          if (opts->prefix == (char *)0x0) {
            pcVar3 = (char *)0x0;
          }
          else {
            nim = nt_image_read(opts,fname,1);
            pcVar3 = local_48;
            if (nim == (nifti_image *)0x0) {
              fprintf(_stderr,"** failed to dup file \'%s\' before modifying\n",fname);
              return 1;
            }
            if (opts->keep_hist != 0) {
              sVar2 = strlen(local_48);
              iVar1 = nifti_add_extension(nim,pcVar3,(int)sVar2,6);
              if (iVar1 != 0) {
                fwrite("** failed to add command to image as exten\n",0x2b,1,_stderr);
              }
            }
            iVar1 = nifti_set_filenames(nim,opts->prefix,1,1);
            if (iVar1 != 0) {
              fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",func,
                      "failed to set prefix for new file: ",opts->prefix);
              nifti_image_free(nim);
              return 1;
            }
            fname = nifti_strdup(nim->fname);
            nifti_image_write(nim);
            if (0x15b < nim->iname_offset) {
              h->vox_offset = (float)nim->iname_offset;
            }
            nifti_image_free(nim);
            pcVar3 = fname;
          }
          write_hdr_to_file(h,fname);
          free(pcVar3);
          free(h);
        }
        else {
          fprintf(_stderr,"** sorry, cannot swap a gzipped header: %s\n",fname);
        }
      }
    }
    uVar5 = 0;
  }
  else {
    fwrite("** can perform only one swap method\n",0x24,1,_stderr);
  }
  return uVar5;
}

Assistant:

int act_swap_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr;
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec, swap;
   char           * fname, * dupname;
   char             func[] = { "act_mod_hdrs" };

   /* count requested operations: "there can be only one", and not Sean */
   swap = opts->swap_hdr + opts->swap_ana + opts->swap_old;
   if( swap > 1 ) {
      fprintf(stderr,"** can perform only one swap method\n");
      return 1;
   } else if( ! swap )
      return 0; /* probably shouldn't be here */

   if( g_debug > 2 )
      fprintf(stderr,"-d swapping headers of %d files...\n",opts->infiles.len);

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      fname = opts->infiles.list[filec];  /* for convenience and mod file */

      if( nifti_is_gzfile(fname) ){
         fprintf(stderr,"** sorry, cannot swap a gzipped header: %s\n", fname);
         continue;
      }

      /* do not validate the header structure */
      nhdr = nt_read_header(opts, fname, &swap, 0);
      if( !nhdr ) return 1;

      if( g_debug > 1 ) {
         char * str = "NIfTI";
         if( opts->swap_ana || (opts->swap_old && !NIFTI_VERSION(*nhdr)) )
            str = "ANALYZE";
         fprintf(stderr,"-d %sswapping %s header of file %s\n",
                 opts->swap_old ? "OLD " : "", str, fname);
      }

      if( ! swap ) {    /* if not yet swapped, do as the user requested */

         if( opts->swap_old ) old_swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
         else                 swap_nifti_header(nhdr, opts->swap_ana ? 0 : 1);

      } else {          /* swapped already: if not correct, need to undo */

         /* if swapped the wrong way, undo and swap as the user requested */
         if ( opts->swap_ana && NIFTI_VERSION(*nhdr) ) {
            /* want swapped as ANALYZE, but was swapped as NIFTI */
            swap_nifti_header(nhdr, 1);  /* undo NIFTI */
            swap_nifti_header(nhdr, 0);  /* swap ANALYZE */
         } else if( opts->swap_hdr && !NIFTI_VERSION(*nhdr) ) {
            /* want swapped as NIFTI, but was swapped as ANALYZE */
            swap_nifti_header(nhdr, 0);  /* undo ANALYZE */
            swap_nifti_header(nhdr, 1);  /* swap NIFTI */
         } else if ( opts->swap_old ) {
            /* undo whichever was done and apply the old way */
            swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
            old_swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
         }

         /* else it was swapped the right way to begin with */

      }

      dupname = NULL;                     /* unless we duplicate file   */

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
      {
         nim = nt_image_read(opts, fname, 1); /* get data */
         if( !nim ) {
            fprintf(stderr,"** failed to dup file '%s' before modifying\n",
                    fname);
            return 1;
         }
         if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                                strlen(opts->command), NIFTI_ECODE_COMMENT) )
               fprintf(stderr,"** failed to add command to image as exten\n");
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }
         dupname = nifti_strdup(nim->fname);  /* so we know to free it */
         fname = dupname;
         nifti_image_write(nim);  /* create the duplicate file */
         /* if we added a history note, get the new offset into the header */
         /* mod: if the new offset is valid, use it    31 Jan 2006 [rickr] */
         if( nim->iname_offset >= 348 ) nhdr->vox_offset = nim->iname_offset;
         nifti_image_free(nim);
      }

      /* if all is well, overwrite header in fname dataset */
      (void)write_hdr_to_file(nhdr, fname); /* errors printed in function */

      if( dupname ) free(dupname);
      free(nhdr);
   }

   return 0;
}